

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_sha1_unittest.cc
# Opt level: O3

void __thiscall
HmacSha1Hash_TestVectors_Test::~HmacSha1Hash_TestVectors_Test(HmacSha1Hash_TestVectors_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HmacSha1Hash, TestVectors) {
  struct {
    const char *test_data;
    const char *key;
    size_t key_len;
    const char *data;
    size_t data_len;
    const char *digest;
  } test[] = {
    { "Hi There",
      "\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b", 16,
      "Hi There", 8,
      "675B0B3A 1B4DDF4E 124872DA 6C2F632B FED957E9" },
    { "what do ya want for nothing?",
      "Jefe", 4,
      "what do ya want for nothing?", 28,
      "EFFCDF6A E5EB2FA2 D27416D5 F184DF9C 259A7C79" },
    { "Fifty repetitions of \\xDD",
      "\xAA\xAA\xAA\xAA\xAA\xAA\xAA\xAA\xAA\xAA\xAA\xAA\xAA\xAA\xAA\xAA", 16,
      "\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD"
      "\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD"
      "\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD\xDD", 50,
      "D730594D 167E35D5 956FD800 3D0DB3D3 F46DC7BB" },
  };

  HMAC_SHA1_CTX ctx;
  uint8_t digest[20];

  for (int k = 0; k < sizeof(test)/sizeof(test[0]); k++){
    HMAC_SHA1_Init(&ctx, (uint8_t*)test[k].key, test[k].key_len);
    HMAC_SHA1_Update(&ctx, (uint8_t*)test[k].data, test[k].data_len);
    HMAC_SHA1_Final(digest, &ctx);
    EXPECT_TRUE(IsEqual(test[k].test_data, digest, test[k].digest));
  }
}